

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O0

int __thiscall FIX::double_conversion::UInt128::DivModPowerOf2(UInt128 *this,int power)

{
  byte bVar1;
  ulong uVar2;
  int result_1;
  uint64_t part_high;
  uint64_t part_low;
  int result;
  int power_local;
  UInt128 *this_local;
  
  bVar1 = (byte)power;
  if (power < 0x40) {
    uVar2 = this->low_bits_ >> (bVar1 & 0x3f);
    this_local._4_4_ = (int)uVar2 + (int)(this->high_bits_ << (0x40 - bVar1 & 0x3f));
    this->high_bits_ = 0;
    this->low_bits_ = this->low_bits_ - (uVar2 << (bVar1 & 0x3f));
  }
  else {
    this_local._4_4_ = (int)(this->high_bits_ >> (bVar1 - 0x40 & 0x3f));
    this->high_bits_ = this->high_bits_ - ((long)this_local._4_4_ << (bVar1 - 0x40 & 0x3f));
  }
  return this_local._4_4_;
}

Assistant:

int DivModPowerOf2(int power) {
    if (power >= 64) {
      int result = static_cast<int>(high_bits_ >> (power - 64));
      high_bits_ -= static_cast<uint64_t>(result) << (power - 64);
      return result;
    } else {
      uint64_t part_low = low_bits_ >> power;
      uint64_t part_high = high_bits_ << (64 - power);
      int result = static_cast<int>(part_low + part_high);
      high_bits_ = 0;
      low_bits_ -= part_low << power;
      return result;
    }
  }